

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O3

void __thiscall Js::AsmJsFunc::ReleaseLocationGeneric(AsmJsFunc *this,EmitExpressionInfo *pnode)

{
  Which WVar1;
  RegSlot tmpReg;
  Types type;
  RegisterSpace *this_00;
  
  if ((pnode != (EmitExpressionInfo *)0x0) && (WVar1 = (pnode->type).which_, WVar1 < Void)) {
    if ((0x1e01U >> (WVar1 & (Float64x2|Floatish)) & 1) == 0) {
      if ((0x34U >> (WVar1 & (Float64x2|Floatish)) & 1) == 0) {
        if ((200U >> (WVar1 & (Float64x2|Floatish)) & 1) == 0) {
          return;
        }
        type = WAsmJs::FromPrimitiveType<float>();
      }
      else {
        type = WAsmJs::FromPrimitiveType<double>();
      }
    }
    else {
      type = WAsmJs::FromPrimitiveType<int>();
    }
    this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,type);
    tmpReg = (pnode->super_EmitInfoBase).location;
    if (tmpReg != 0xffffffff) {
      WAsmJs::RegisterSpace::ReleaseTmpRegister(this_00,tmpReg);
      return;
    }
  }
  return;
}

Assistant:

void AsmJsFunc::ReleaseLocationGeneric(const EmitExpressionInfo* pnode)
    {
        if (pnode)
        {
            if (pnode->type.isIntish())
            {
                ReleaseLocation<int>(pnode);
            }
            else if (pnode->type.isMaybeDouble())
            {
                ReleaseLocation<double>(pnode);
            }
            else if (pnode->type.isFloatish())
            {
                ReleaseLocation<float>(pnode);
            }
        }
    }